

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseBinding.cpp
# Opt level: O1

TestCaseGroup * vkt::sparse::createImageSparseBindingTests(TestContext *testCtx)

{
  ImageType IVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  TestNode *this;
  TestNode *this_00;
  TestNode *this_01;
  ostream *poVar5;
  TestNode *node;
  ImageType imageType;
  TextureFormat *format;
  long lVar6;
  long lVar7;
  ostringstream stream;
  long local_228;
  ImageParameters *local_210;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"image_sparse_binding","Buffer Sparse Binding");
  if (createImageSparseBindingTests(tcu::TestContext&)::imageParametersArray == '\0') {
    createImageSparseBindingTests();
  }
  if (createImageSparseBindingTests(tcu::TestContext&)::formats == '\0') {
    createImageSparseBindingTests();
  }
  lVar6 = 0;
  local_210 = createImageSparseBindingTests::imageParametersArray;
  do {
    IVar1 = createImageSparseBindingTests::imageParametersArray[lVar6].imageType;
    this_00 = (TestNode *)operator_new(0x70);
    getImageTypeName_abi_cxx11_(local_1a8,(sparse *)(ulong)IVar1,imageType);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,testCtx,local_1a8[0]._M_dataplus._M_p,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_228 = 0;
    do {
      this_01 = (TestNode *)operator_new(0x70);
      getShaderImageFormatQualifier_abi_cxx11_
                (local_1a8,(sparse *)(createImageSparseBindingTests::formats + local_228),format);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)this_01,testCtx,local_1a8[0]._M_dataplus._M_p,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      lVar7 = 0xc;
      do {
        uVar2 = *(undefined4 *)((long)(local_210->imageSizes + -1) + lVar7);
        uVar3 = *(undefined4 *)((long)local_210->imageSizes[0].m_data + lVar7 + -8);
        uVar4 = *(undefined4 *)((long)local_210->imageSizes[0].m_data + lVar7 + -4);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        node = (TestNode *)operator_new(0x88);
        std::__cxx11::stringbuf::str();
        local_1e8[0] = local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
        tcu::TestCase::TestCase((TestCase *)node,testCtx,(char *)local_1c8,(char *)local_1e8[0]);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2dbf8;
        *(ImageType *)&node[1]._vptr_TestNode = IVar1;
        *(undefined4 *)((long)&node[1]._vptr_TestNode + 4) = uVar2;
        *(undefined4 *)&node[1].m_testCtx = uVar3;
        *(undefined4 *)((long)&node[1].m_testCtx + 4) = uVar4;
        node[1].m_name._M_dataplus._M_p = (pointer)createImageSparseBindingTests::formats[local_228]
        ;
        tcu::TestNode::addChild(this_01,node);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      tcu::TestNode::addChild(this_00,this_01);
      local_228 = local_228 + 1;
    } while (local_228 != 6);
    tcu::TestNode::addChild(this,this_00);
    lVar6 = lVar6 + 1;
    local_210 = local_210 + 1;
  } while (lVar6 != 7);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createImageSparseBindingTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_sparse_binding", "Buffer Sparse Binding"));

	static const deUint32 sizeCountPerImageType = 3u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_1D,		{ tcu::UVec3(512u, 1u,   1u ), tcu::UVec3(1024u, 1u,   1u), tcu::UVec3(11u,  1u,   1u) } },
		{ IMAGE_TYPE_1D_ARRAY,  { tcu::UVec3(512u, 1u,   64u), tcu::UVec3(1024u, 1u,   8u), tcu::UVec3(11u,  1u,   3u) } },
		{ IMAGE_TYPE_2D,		{ tcu::UVec3(512u, 256u, 1u ), tcu::UVec3(1024u, 128u, 1u), tcu::UVec3(11u,  137u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	{ tcu::UVec3(512u, 256u, 6u ), tcu::UVec3(1024u, 128u, 8u), tcu::UVec3(11u,  137u, 3u) } },
		{ IMAGE_TYPE_3D,		{ tcu::UVec3(512u, 256u, 6u ), tcu::UVec3(1024u, 128u, 8u), tcu::UVec3(11u,  137u, 3u) } },
		{ IMAGE_TYPE_CUBE,		{ tcu::UVec3(256u, 256u, 1u ), tcu::UVec3(128u,  128u, 1u), tcu::UVec3(137u, 137u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY,{ tcu::UVec3(256u, 256u, 6u ), tcu::UVec3(128u,  128u, 8u), tcu::UVec3(137u, 137u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)
	};

	for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
	{
		const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
		de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(imageType).c_str(), ""));

		for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		{
			const tcu::TextureFormat&		format = formats[formatNdx];
			de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

			for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
			{
				const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

				std::ostringstream stream;
				stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

				formatGroup->addChild(new ImageSparseBindingCase(testCtx, stream.str(), "", imageType, imageSize, format));
			}
			imageTypeGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageTypeGroup.release());
	}

	return testGroup.release();
}